

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase1958::run(TestCase1958 *this)

{
  SourceLocation location;
  OwnPromiseNode OVar1;
  TransformPromiseNodeBase *this_00;
  Promise<void> p;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:1973:20),_void>
  p2;
  WaitScope waitScope;
  DebugComparison<int,_int> _kjCondition;
  EventLoop loop;
  OwnPromiseNode local_2b0;
  OwnPromiseNode local_2a8;
  WaitScope local_2a0;
  char *local_280;
  char *pcStack_278;
  undefined8 local_270;
  DebugComparison<int,_int> local_268;
  ExceptionOrValue local_248;
  char local_a8;
  int local_98;
  EventLoop local_80;
  
  EventLoop::EventLoop(&local_80);
  local_2a0.busyPollInterval = 0xffffffff;
  local_2a0.fiber.ptr = (FiberBase *)0x0;
  local_2a0.runningStacksPool.ptr = (FiberPool *)0x0;
  local_2a0.loop = &local_80;
  EventLoop::enterScope(&local_80);
  kj::_::readyNow();
  local_2b0.ptr =
       (PromiseNode *)CONCAT71(local_248.exception.ptr._1_7_,local_248.exception.ptr.isSet);
  this_00 = (TransformPromiseNodeBase *)operator_new(0x40);
  kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_00,&local_2b0,
             kj::_::
             SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:1973:20)>
             ::anon_class_32_2_74578e90_for_func::operator());
  (this_00->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember =
       (_func_int **)&PTR_destroy_00604d40;
  *(undefined4 *)&this_00[1].super_PromiseNode.super_PromiseArenaMember._vptr_PromiseArenaMember =
       0x7b;
  *(undefined4 *)&this_00[1].dependency.ptr = 0x1c8;
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcStack_278 = "run";
  local_270 = 0x28000007b9;
  local_248.exception.ptr.isSet = false;
  local_a8 = '\0';
  location.function = "run";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  location.lineNumber = 0x7b9;
  location.columnNumber = 0x28;
  local_2a8.ptr = (PromiseNode *)this_00;
  kj::_::waitImpl(&local_2a8,&local_248,&local_2a0,location);
  if (local_a8 == '\x01') {
    if (local_248.exception.ptr.isSet != false) {
      throwRecoverableException(&local_248.exception.ptr.field_1.value,0);
    }
    if ((local_248.exception.ptr.isSet & 1U) != 0) {
      Exception::~Exception(&local_248.exception.ptr.field_1.value);
    }
    local_268.left = local_98;
    local_268.right = 0x243;
    local_268.op.content.ptr = " == ";
    local_268.op.content.size_ = 5;
    local_268.result = local_98 == 0x243;
    if ((!local_268.result) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[45],kj::_::DebugComparison<int,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x7b9,ERROR,"\"failed: expected \" \"p2.wait(waitScope).i == 579\", _kjCondition",
                 (char (*) [45])"failed: expected p2.wait(waitScope).i == 579",&local_268);
    }
    OVar1.ptr = local_2a8.ptr;
    if ((TransformPromiseNodeBase *)local_2a8.ptr != (TransformPromiseNodeBase *)0x0) {
      local_2a8.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(OVar1.ptr)->super_PromiseArenaMember);
    }
    OVar1.ptr = local_2b0.ptr;
    if (&(local_2b0.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
      local_2b0.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(OVar1.ptr)->super_PromiseArenaMember);
    }
    if (local_2a0.fiber.ptr == (FiberBase *)0x0) {
      EventLoop::leaveScope(local_2a0.loop);
    }
    EventLoop::~EventLoop(&local_80);
    return;
  }
  if (local_248.exception.ptr.isSet != false) {
    throwFatalException(&local_248.exception.ptr.field_1.value,0);
  }
  kj::_::unreachable();
}

Assistant:

~WeirdAlign() {
      KJ_EXPECT(reinterpret_cast<uintptr_t>(this) % 16 == 0);
    }